

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

void __thiscall
duckdb::Linenoise::EditCapitalizeNextWord(Linenoise *this,Capitalization capitalization)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  
  uVar2 = this->pos;
  uVar3 = this->len;
  if (uVar2 < uVar3) {
    do {
      if ((0x20 < (ulong)(byte)this->buf[uVar2]) ||
         ((0x100002600U >> ((ulong)(byte)this->buf[uVar2] & 0x3f) & 1) == 0)) goto LAB_002149fa;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  else {
LAB_002149fa:
    bVar5 = uVar2 < uVar3;
    uVar3 = uVar2;
    if (bVar5) {
      bVar1 = 1;
      do {
        bVar4 = this->buf[uVar3];
        if (((ulong)bVar4 < 0x21) && ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) break;
        if (capitalization == UPPERCASE) {
          if ((byte)(bVar4 + 0x9f) < 0x1a) {
            bVar4 = bVar4 - 0x20;
LAB_00214a77:
            this->buf[uVar3] = bVar4;
          }
        }
        else if (capitalization == LOWERCASE) {
          if ((byte)(bVar4 + 0xbf) < 0x1a) {
            bVar4 = bVar4 | 0x20;
            goto LAB_00214a77;
          }
        }
        else if (capitalization == CAPITALIZE) {
          if (!(bool)(~bVar1 & 1 | 0x19 < (byte)(bVar4 + 0x9f))) {
            bVar4 = bVar4 - 0x20;
            bVar1 = 0;
            goto LAB_00214a77;
          }
          bVar1 = 0;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->len);
    }
  }
  this->pos = uVar3;
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditCapitalizeNextWord(Capitalization capitalization) {
	size_t next_pos = pos;

	// find the next word
	while (next_pos < len && IsSpace(buf[next_pos])) {
		next_pos++;
	}
	bool first_char = true;
	while (next_pos < len && !IsSpace(buf[next_pos])) {
		switch (capitalization) {
		case Capitalization::CAPITALIZE: {
			if (first_char) {
				first_char = false;
				if (buf[next_pos] >= 'a' && buf[next_pos] <= 'z') {
					buf[next_pos] -= 'a' - 'A';
				}
			}
			break;
		}
		case Capitalization::LOWERCASE: {
			if (buf[next_pos] >= 'A' && buf[next_pos] <= 'Z') {
				buf[next_pos] += 'a' - 'A';
			}
			break;
		}
		case Capitalization::UPPERCASE: {
			if (buf[next_pos] >= 'a' && buf[next_pos] <= 'z') {
				buf[next_pos] -= 'a' - 'A';
			}
			break;
		}
		default:
			break;
		}
		next_pos++;
	}
	pos = next_pos;
	RefreshLine();
}